

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_unlink.c
# Opt level: O3

mpt_node * mpt_node_unlink(mpt_node *curr)

{
  mpt_node *pmVar1;
  mpt_node *pmVar2;
  int *piVar3;
  mpt_node **ppmVar4;
  
  if (curr == (mpt_node *)0x0) {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
    return (mpt_node *)0x0;
  }
  pmVar1 = curr->next;
  pmVar2 = curr->prev;
  if (pmVar1 != (mpt_node *)0x0) {
    pmVar1->prev = pmVar2;
  }
  if (pmVar2 == (mpt_node *)0x0) {
    if (curr->parent == (mpt_node *)0x0) goto LAB_00116b10;
    ppmVar4 = &curr->parent->children;
  }
  else {
    ppmVar4 = &pmVar2->next;
  }
  *ppmVar4 = pmVar1;
LAB_00116b10:
  curr->next = (mpt_node *)0x0;
  curr->prev = (mpt_node *)0x0;
  curr->parent = (mpt_node *)0x0;
  return pmVar1;
}

Assistant:

extern MPT_STRUCT(node) *mpt_node_unlink(MPT_STRUCT(node) *curr)
{
	MPT_STRUCT(node)  *next;
	
	if (!curr) {
		errno = EINVAL;
		return 0;
	}
	/* change predecessor of successor */
	if ((next = curr->next)) {
		next->prev = curr->prev;
	}
	/* change successor of predecessor */
	if (curr->prev) {
		curr->prev->next = next;
	}
	/* if no predecessor change child link of parent (if exists) */
	else if (curr->parent) {
		curr->parent->children = next;
	}
	curr->parent = curr->next = curr->prev = 0;
	
	return next;
}